

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O1

MRIStepCoupling MRIStepCoupling_MIStoMRI(ARKodeButcherTable B,int q,int p)

{
  int iVar1;
  int iVar2;
  realtype *prVar3;
  realtype *prVar4;
  realtype ***ppprVar5;
  realtype **pprVar6;
  realtype **pprVar7;
  realtype *prVar8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  MRIStepCoupling pMVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint stages;
  ulong uVar16;
  MRISTEP_METHOD_TYPE MVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  MRISTEP_METHOD_TYPE type;
  double dVar21;
  
  if (B == (ARKodeButcherTable)0x0) {
    return (MRIStepCoupling)0x0;
  }
  prVar3 = B->c;
  dVar21 = ABS(*prVar3);
  iVar1 = B->stages;
  uVar20 = (ulong)iVar1;
  if (0 < (long)uVar20) {
    uVar13 = 0;
    do {
      dVar21 = dVar21 + ABS((*B->A)[uVar13]);
      uVar13 = uVar13 + 1;
    } while (uVar20 != uVar13);
  }
  if ((dVar21 <= 2.220446049250313e-14) && (prVar3[uVar20 - 1] <= 1.0000000000000222)) {
    if (1 < iVar1) {
      uVar13 = 1;
      do {
        if (prVar3[uVar13] - prVar3[uVar13 - 1] < -2.220446049250313e-14) {
          return (MRIStepCoupling)0x0;
        }
        uVar13 = uVar13 + 1;
      } while (uVar20 != uVar13);
    }
    if (0 < iVar1) {
      dVar21 = 0.0;
      lVar11 = 0;
      uVar13 = uVar20;
      uVar19 = 0;
      do {
        uVar14 = uVar19 + 1;
        if (uVar14 < uVar20) {
          uVar16 = 1;
          do {
            dVar21 = dVar21 + ABS(*(double *)((long)B->A[uVar19] + uVar16 * 8 + lVar11));
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
        }
        lVar11 = lVar11 + 8;
        uVar13 = uVar13 - 1;
        uVar19 = uVar14;
      } while (uVar14 != uVar20);
      if (2.220446049250313e-14 < dVar21) {
        return (MRIStepCoupling)0x0;
      }
    }
    dVar21 = ABS(prVar3[uVar20 - 1] + -1.0);
    bVar10 = 2.220446049250313e-14 < dVar21;
    if (0 < iVar1) {
      uVar13 = 0;
      bVar9 = 2.220446049250313e-14 < dVar21;
      do {
        bVar10 = true;
        if (ABS(B->A[uVar20 - 1][uVar13] - B->b[uVar13]) <= 2.220446049250313e-14) {
          bVar10 = bVar9;
        }
        uVar13 = uVar13 + 1;
        bVar9 = bVar10;
      } while (uVar20 != uVar13);
    }
    stages = iVar1 + (uint)bVar10;
    if (iVar1 < 1) {
      type = MRISTEP_EXPLICIT;
    }
    else {
      lVar11 = 0;
      uVar19 = 0;
      type = MRISTEP_EXPLICIT;
      uVar13 = uVar20;
      do {
        uVar14 = 0;
        MVar17 = type;
        do {
          type = MRISTEP_IMPLICIT;
          if (ABS(*(double *)((long)B->A[uVar19] + uVar14 * 8 + lVar11)) <= 2.220446049250313e-14) {
            type = MVar17;
          }
          uVar14 = uVar14 + 1;
          MVar17 = type;
        } while (uVar13 != uVar14);
        uVar19 = uVar19 + 1;
        lVar11 = lVar11 + 8;
        uVar13 = uVar13 - 1;
      } while (uVar19 != uVar20);
    }
    pMVar12 = MRIStepCoupling_Alloc(1,stages,type);
    if (pMVar12 != (MRIStepCoupling)0x0) {
      pMVar12->q = q;
      pMVar12->p = p;
      iVar2 = B->stages;
      lVar11 = (long)iVar2;
      if (0 < lVar11) {
        prVar3 = B->c;
        prVar4 = pMVar12->c;
        lVar15 = 0;
        do {
          prVar4[lVar15] = prVar3[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar11 != lVar15);
      }
      if (bVar10 != 0) {
        pMVar12->c[(long)(int)stages + -1] = 1.0;
      }
      ppprVar5 = (&pMVar12->W)[type != MRISTEP_EXPLICIT];
      if (0 < (int)stages) {
        pprVar6 = *ppprVar5;
        uVar20 = 0;
        do {
          memset(pprVar6[uVar20],0,(ulong)((iVar1 + (uint)bVar10) - 1) * 8 + 8);
          uVar20 = uVar20 + 1;
        } while (stages != uVar20);
      }
      if (1 < iVar2) {
        pprVar6 = B->A;
        pprVar7 = *ppprVar5;
        lVar15 = 1;
        do {
          prVar3 = pprVar6[lVar15 + -1];
          prVar4 = pprVar6[lVar15];
          prVar8 = pprVar7[lVar15];
          lVar18 = 0;
          do {
            prVar8[lVar18] = prVar4[lVar18] - prVar3[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar11 != lVar18);
          lVar15 = lVar15 + 1;
        } while (lVar15 != lVar11);
      }
      if (0 < iVar2 && bVar10 == true) {
        prVar3 = B->b;
        prVar4 = B->A[lVar11 + -1];
        prVar8 = (*ppprVar5)[(long)(int)stages + -1];
        lVar15 = 0;
        do {
          prVar8[lVar15] = prVar3[lVar15] - prVar4[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar11 != lVar15);
        return pMVar12;
      }
      return pMVar12;
    }
  }
  return (MRIStepCoupling)0x0;
}

Assistant:

MRIStepCoupling MRIStepCoupling_MIStoMRI(ARKodeButcherTable B,
                                         int q, int p)
{
  int i, j, stages;
  booleantype padding;
  realtype Asum;
  realtype ***C;
  MRISTEP_METHOD_TYPE type;
  MRIStepCoupling MRIC;

  const realtype tol = RCONST(100.0) * UNIT_ROUNDOFF;

  /* Check that input table is non-NULL */
  if (!B) return(NULL);

  /* -----------------------------------
   * Check that the input table is valid
   * ----------------------------------- */

  /* First stage is just old solution */
  Asum = SUNRabs(B->c[0]);
  for (j=0; j<B->stages; j++)
    Asum += SUNRabs(B->A[0][j]);
  if (Asum > tol) return(NULL);

  /* Last stage exceeds 1 */
  if (B->c[B->stages-1] > ONE+tol) return(NULL);

  /* All stages are sorted */
  for (j=1; j<B->stages; j++)
    if ((B->c[j] - B->c[j-1]) < -tol) return(NULL);

  /* Each stage at most diagonally implicit */
  Asum = ZERO;
  for (i=0; i<B->stages; i++)
    for (j=i+1; j<B->stages; j++)
      Asum += SUNRabs(B->A[i][j]);
  if (Asum > tol) return(NULL);

  /* -----------------------------------------
   * determine whether the table needs padding
   * ----------------------------------------- */

  padding = SUNFALSE;

  /* Last stage time should equal 1 */
  if (SUNRabs(B->c[B->stages-1] - ONE) > tol)
    padding = SUNTRUE;

  /* Last row of A should equal b */
  for (j=0; j<B->stages; j++) {
    if (SUNRabs(B->A[B->stages-1][j] - B->b[j]) > tol)
      padding = SUNTRUE;
  }
  stages = (padding) ? B->stages+1 : B->stages;

  /* -------------------------
   * determine the method type
   * ------------------------- */

  /* Check if the table is strictly lower triangular (explicit) */
  type = MRISTEP_EXPLICIT;

  for (i=0; i<B->stages; i++)
    for (j=i; j<B->stages; j++)
      if (SUNRabs(B->A[i][j]) > tol)
        type = MRISTEP_IMPLICIT;

  /* ----------------------------
   * construct coupling structure
   * ---------------------------- */

  MRIC = MRIStepCoupling_Alloc(1, stages, type);
  if (!MRIC) return(NULL);

  /* Copy method/embedding orders */
  MRIC->q = q;
  MRIC->p = p;

  /* Copy abscissae, padding if needed */
  for (i=0; i<B->stages; i++)
    MRIC->c[i] = B->c[i];

  if (padding)
    MRIC->c[stages-1] = ONE;

  /* Construct the coupling table */
  if (type == MRISTEP_EXPLICIT)
    C = MRIC->W;
  else
    C = MRIC->G;

  /* First row is identically zero */
  for (i=0; i<stages; i++)
    for (j=0; j<stages; j++)
      C[0][i][j] = ZERO;

  /* Remaining rows = A(2:end,:) - A(1:end-1,:) */
  for (i=1; i<B->stages; i++)
    for (j=0; j<B->stages; j++)
      C[0][i][j] = B->A[i][j] - B->A[i-1][j];

  /* Padded row = b(:) - A(end,:) */
  if (padding)
    for (j=0; j<B->stages; j++)
      C[0][stages-1][j] = B->b[j] - B->A[B->stages-1][j];

  return(MRIC);
}